

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Random.cpp
# Opt level: O3

void amrex::RestoreRandomState(istream *is,int nthreads_old,int nstep_old)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *pmVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *pmVar10;
  ulong uVar11;
  size_t __i;
  long lVar12;
  
  uVar9 = (uint)::(anonymous_namespace)::nthreads;
  uVar5 = nthreads_old;
  if ((int)uVar9 < nthreads_old) {
    uVar5 = uVar9;
  }
  if (0 < (int)uVar5) {
    std::
    operator>><unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL,_char,_std::char_traits<char>_>
              (is,::(anonymous_namespace)::generators);
    uVar9 = (uint)::(anonymous_namespace)::nthreads;
  }
  pmVar4 = ::(anonymous_namespace)::generators;
  if (nthreads_old < (int)uVar9) {
    iVar1 = *(int *)(ParallelContext::frames + 0xc);
    iVar2 = *(int *)(ParallelContext::frames + 0x10);
    iVar8 = uVar9 * iVar2;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)(nstep_old + 1);
    iVar7 = nstep_old * iVar8;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar3,0) <= (ulong)(long)iVar8)
    {
      iVar7 = 0;
    }
    uVar6 = (ulong)nthreads_old;
    pmVar10 = ::(anonymous_namespace)::generators + uVar6;
    do {
      uVar11 = (ulong)(uint)(iVar2 * (int)uVar6 + iVar1 + 1 + iVar7);
      pmVar4[uVar6]._M_x[0] = uVar11;
      lVar12 = 1;
      do {
        uVar11 = (ulong)(((uint)(uVar11 >> 0x1e) ^ (uint)uVar11) * 0x6c078965 + (int)lVar12);
        pmVar10->_M_x[lVar12] = uVar11;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x270);
      pmVar4[uVar6]._M_p = 0x270;
      uVar6 = uVar6 + 1;
      pmVar10 = pmVar10 + 1;
    } while (uVar6 != uVar9);
  }
  return;
}

Assistant:

void
amrex::RestoreRandomState (std::istream& is, int nthreads_old, int nstep_old)
{
    int N = std::min(nthreads, nthreads_old);
    for (int i = 0; i < N; i++)
        is >> generators[i];
    if (nthreads > nthreads_old) {
        const int NProcs = ParallelDescriptor::NProcs();
        const int MyProc = ParallelDescriptor::MyProc();
        for (int i = nthreads_old; i < nthreads; i++) {
            amrex::ULong seed = MyProc+1 + i*NProcs;
            if (std::numeric_limits<amrex::ULong>::max()/(amrex::ULong)(nstep_old+1)
                > static_cast<amrex::ULong>(nthreads*NProcs)) // avoid overflow
            {
                seed += nstep_old*nthreads*NProcs;
            }

            generators[i].seed(seed);
        }
    }
}